

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O1

mp_int ** get_out_val_mpint(BinarySource *in)

{
  Value *pVVar1;
  finaliser *pfVar2;
  
  pVVar1 = value_new(VT_mpint);
  pfVar2 = (finaliser *)safegrowarray(finalisers,&finalisersize,0x10,nfinalisers,1,false);
  finalisers = pfVar2;
  pfVar2[nfinalisers].fn = finaliser_return_value;
  pfVar2[nfinalisers].ctx = pVVar1;
  nfinalisers = nfinalisers + 1;
  return (mp_int **)&pVVar1->field_2;
}

Assistant:

static mp_int **get_out_val_mpint(BinarySource *in)
{
    Value *val = value_new(VT_mpint);
    add_finaliser(finaliser_return_value, val);
    return &val->vu_mpint;
}